

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_433923::MmuTest_set_membanks_Test::TestBody(MmuTest_set_membanks_Test *this)

{
  bool bVar1;
  IMmu *pIVar2;
  _Head_base<0UL,_n_e_s::core::test::MockMemBank_*,_false> this_00;
  MockMemBank *this_01;
  TypedExpectation<bool_(unsigned_short)> *this_02;
  ActionInterface<bool_(unsigned_short)> *impl;
  pointer *__ptr;
  __single_object mem_bank;
  MemBankList mem_banks;
  _Head_base<0UL,_n_e_s::core::test::MockMemBank_*,_false> local_c8;
  MatcherBase<unsigned_char> local_c0;
  Action<bool_(unsigned_short)> local_a8;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_88;
  bool *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  local_38;
  
  this_01 = (MockMemBank *)operator_new(0xe0);
  memset(this_01,0,0xe0);
  (this_01->super_IMemBank)._vptr_IMemBank = (_func_int **)&PTR__MockMemBank_002adfe8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this_01->gmock11_is_address_in_range_11).super_UntypedFunctionMockerBase);
  (this_01->gmock11_is_address_in_range_11).super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_002adbb0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this_01->gmock11_read_byte_13).super_UntypedFunctionMockerBase);
  (this_01->gmock11_read_byte_13).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002a0b30;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this_01->gmock02_write_byte_15).super_UntypedFunctionMockerBase);
  (this_01->gmock02_write_byte_15).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002a0cd0;
  local_c8._M_head_impl = this_01;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_a8,0x4d2);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_c0,'*');
  n_e_s::core::test::MockMemBank::gmock_write_byte
            (&local_88,this_01,(Matcher<unsigned_short> *)&local_a8,
             (Matcher<unsigned_char> *)&local_c0);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            (&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
             ,0x5f,"*mem_bank","write_byte(1234u, 42u)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &local_88.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)&local_88.matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_c0);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_a8);
  this_00._M_head_impl = local_c8._M_head_impl;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_c0,0x4d2);
  n_e_s::core::test::MockMemBank::gmock_is_address_in_range
            ((MockSpec<bool_(unsigned_short)> *)&local_88,this_00._M_head_impl,
             (Matcher<unsigned_short> *)&local_c0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<bool_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<bool_(unsigned_short)> *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                       ,0x60,"*mem_bank","is_address_in_range(1234u)");
  local_48 = (bool *)operator_new(1);
  *local_48 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_40,local_48);
  impl = (ActionInterface<bool_(unsigned_short)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002ae130;
  bVar1 = *local_48;
  *(bool *)&impl[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&impl[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(unsigned_short)>::Action(&local_a8,impl);
  testing::internal::TypedExpectation<bool_(unsigned_short)>::WillOnce(this_02,&local_a8);
  if (local_a8.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.fun_.super__Function_base._M_manager)(&local_a8,&local_a8,3);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_88.matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_c0);
  local_88.function_mocker_ = (FunctionMocker<void_(unsigned_short,_unsigned_char)> *)0x0;
  local_88.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)0x0;
  local_88.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.vtable_ = (VTable *)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::
  emplace_back<std::unique_ptr<n_e_s::core::test::MockMemBank,std::default_delete<n_e_s::core::test::MockMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)&local_88,
             (unique_ptr<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>_>
              *)&local_c8);
  local_38.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88.function_mocker_;
  local_38.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_88.matchers_.
                super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
                .super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
                super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
                super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface.
                _vptr_MatcherDescriberInterface;
  local_38.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_88.matchers_.
                super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
                .super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
                super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
                super_MatcherBase<unsigned_char>.vtable_;
  local_88.function_mocker_ = (FunctionMocker<void_(unsigned_short,_unsigned_char)> *)0x0;
  local_88.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)0x0;
  local_88.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.vtable_ = (VTable *)0x0;
  (*((this->super_MmuTest).mmu._M_t.
     super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
     super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
     super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl)->_vptr_IMmu[2])();
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_38);
  pIVar2 = (this->super_MmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IMmu[4])(pIVar2,0x4d2,0x2a);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector((vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
             *)&local_88);
  if (local_c8._M_head_impl != (MockMemBank *)0x0) {
    (*((local_c8._M_head_impl)->super_IMemBank)._vptr_IMemBank[1])();
  }
  return;
}

Assistant:

TEST_F(MmuTest, set_membanks) {
    auto mem_bank = std::make_unique<MockMemBank>();

    EXPECT_CALL(*mem_bank, write_byte(1234u, 42u));
    EXPECT_CALL(*mem_bank, is_address_in_range(1234u))
            .WillOnce(testing::Return(true));

    MemBankList mem_banks;
    mem_banks.emplace_back(std::move(mem_bank));
    mmu->set_mem_banks(std::move(mem_banks));

    mmu->write_byte(1234u, 42u);
}